

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

lys_module * lyd_node_module(lyd_node *node)

{
  lys_module *plVar1;
  ly_ctx *local_38;
  ly_ctx *local_30;
  lyd_node_opaq *opaq;
  lyd_node *node_local;
  
  opaq = (lyd_node_opaq *)node;
  while( true ) {
    if (opaq == (lyd_node_opaq *)0x0) {
      return (lys_module *)0x0;
    }
    if ((opaq->field_0).node.schema != (lysc_node *)0x0) break;
    if (opaq->format == LY_VALUE_XML) {
      if ((opaq->name).field_2.module_ns != (char *)0x0) {
        if ((opaq->field_0).node.schema == (lysc_node *)0x0) {
          local_30 = opaq->ctx;
        }
        else {
          local_30 = ((opaq->field_0).node.schema)->module->ctx;
        }
        plVar1 = ly_ctx_get_module_implemented_ns(local_30,(opaq->name).field_2.module_ns);
        return plVar1;
      }
    }
    else if ((opaq->format == LY_VALUE_JSON) && ((opaq->name).field_2.module_ns != (char *)0x0)) {
      if ((opaq->field_0).node.schema == (lysc_node *)0x0) {
        local_38 = opaq->ctx;
      }
      else {
        local_38 = ((opaq->field_0).node.schema)->module->ctx;
      }
      plVar1 = ly_ctx_get_module_implemented(local_38,(opaq->name).field_2.module_ns);
      return plVar1;
    }
    opaq = (lyd_node_opaq *)lyd_parent((lyd_node *)opaq);
  }
  return ((opaq->field_0).node.schema)->module;
}

Assistant:

lys_module *
lyd_node_module(const struct lyd_node *node)
{
    const struct lyd_node_opaq *opaq;

    while (node) {
        /* data node */
        if (node->schema) {
            return node->schema->module;
        }

        /* opaque node */
        opaq = (struct lyd_node_opaq *)node;
        switch (opaq->format) {
        case LY_VALUE_XML:
            if (opaq->name.module_ns) {
                return ly_ctx_get_module_implemented_ns(LYD_CTX(node), opaq->name.module_ns);
            }
            break;
        case LY_VALUE_JSON:
            if (opaq->name.module_name) {
                return ly_ctx_get_module_implemented(LYD_CTX(node), opaq->name.module_name);
            }
            break;
        default:
            break;
        }

        node = lyd_parent(node);
    }

    return NULL;
}